

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

double __thiscall despot::BaseTag::Reward(BaseTag *this,int s,ACT_TYPE action)

{
  int iVar1;
  double dVar2;
  
  if (action == 4) {
    iVar1 = *(int *)&(this->states_).
                     super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[s]->field_0xc;
    dVar2 = TAG_REWARD;
    if ((this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar1] !=
        (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar1]) {
      dVar2 = -TAG_REWARD;
    }
    return dVar2;
  }
  return -1.0;
}

Assistant:

double BaseTag::Reward(int s, ACT_TYPE action) const {
	const TagState* state = states_[s];
	double reward = 0;
	if (action == TagAction()) {
		if (rob_[state->state_id] == opp_[state->state_id]) {
			reward = TAG_REWARD;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}
	return reward;
}